

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void e2e_multi_kvs_concurrent_wr(void)

{
  fdb_status fVar1;
  time_t tVar2;
  fdb_iterator *in_stack_fffffffffffffce8;
  fdb_iterator *in_stack_fffffffffffffcf8;
  size_t in_stack_fffffffffffffd08;
  void *in_stack_fffffffffffffd10;
  size_t in_stack_fffffffffffffd18;
  void *in_stack_fffffffffffffd20;
  fdb_kvs_handle *in_stack_fffffffffffffd28;
  fdb_doc **in_stack_fffffffffffffd60;
  fdb_iterator *in_stack_fffffffffffffd68;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_iterator *it;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_kvs_handle **kvs;
  fdb_file_handle *dbfile;
  void **thread_ret_wr;
  pthread_t *tid_wr;
  char body [64];
  char buf [64];
  int nf;
  int r;
  int j;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  rm_storage_fs();
  system("rm -rf  e2edb_main > errorlog.txt");
  fdb_get_default_config();
  fconfig.max_block_reusing_cycle = 10;
  fdb_get_default_kvs_config();
  fconfig.flags._2_1_ = 0;
  fdb_open((fdb_file_handle **)tid_wr,&stack0xfffffffffffffd68,
           (fdb_config *)&stack0xfffffffffffffd28);
  r = 0;
  do {
    if (7 < r) {
      nf = 0;
      do {
        if (9 < nf) {
          for (r = 0; r < 8; r = r + 1) {
            pthread_create((pthread_t *)(&stack0xfffffffffffffd68 + (long)r * 8),
                           (pthread_attr_t *)0x0,update_thread,
                           *(void **)(&stack0xfffffffffffffce8 + (long)r * 8));
          }
          r = 0;
          do {
            if (7 < r) {
              fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffce8,'\0');
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                        ,0x5e9);
                e2e_multi_kvs_concurrent_wr::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                                ,0x5e9,"void e2e_multi_kvs_concurrent_wr()");
                }
              }
              r = 0;
              do {
                if (7 < r) {
                  fdb_commit((fdb_file_handle *)in_stack_fffffffffffffce8,'\0');
                  fdb_close((fdb_file_handle *)in_stack_fffffffffffffce8);
                  fdb_shutdown();
                  memleak_end();
                  system("rm -rf  e2edb_main > errorlog.txt");
                  if (e2e_multi_kvs_concurrent_wr::__test_pass == 0) {
                    fprintf(_stderr,"%s FAILED\n","TEST: e2e multi kvs concurrent wr test");
                  }
                  else {
                    fprintf(_stderr,"%s PASSED\n","TEST: e2e multi kvs concurrent wr test");
                  }
                  return;
                }
                fVar1 = fdb_iterator_init(*(fdb_kvs_handle **)
                                           (&stack0xfffffffffffffce8 + (long)r * 8),
                                          (fdb_iterator **)&fconfig.num_blocks_readahead,(void *)0x0
                                          ,0,(void *)0x0,0,0);
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                          ,0x5ee);
                  e2e_multi_kvs_concurrent_wr::__test_pass = 0;
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    __assert_fail("status == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                                  ,0x5ee,"void e2e_multi_kvs_concurrent_wr()");
                  }
                }
                nf = 0;
                do {
                  fVar1 = fdb_iterator_get(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    fprintf(_stderr,"Test failed: %s %d\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                            ,0x5f2);
                    e2e_multi_kvs_concurrent_wr::__test_pass = 0;
                    if (fVar1 != FDB_RESULT_SUCCESS) {
                      __assert_fail("status == FDB_RESULT_SUCCESS",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                                    ,0x5f2,"void e2e_multi_kvs_concurrent_wr()");
                    }
                  }
                  fdb_doc_free((fdb_doc *)0x108df6);
                  nf = nf + 1;
                  fVar1 = fdb_iterator_next(in_stack_fffffffffffffce8);
                } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
                if (nf != 7) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                          ,0x5f7);
                  e2e_multi_kvs_concurrent_wr::__test_pass = 0;
                  if (nf != 7) {
                    __assert_fail("j==7",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                                  ,0x5f7,"void e2e_multi_kvs_concurrent_wr()");
                  }
                }
                fdb_iterator_close(in_stack_fffffffffffffcf8);
                r = r + 1;
              } while( true );
            }
            pthread_join(*(pthread_t *)(&stack0xfffffffffffffd68 + (long)r * 8),
                         (void **)(&((fdb_config *)&stack0xfffffffffffffd28)->chunksize +
                                  (long)r * 4));
            fVar1 = fdb_rollback((fdb_kvs_handle **)fconfig._40_8_,
                                 CONCAT17(fconfig.flags._3_1_,
                                          CONCAT16(fconfig.flags._2_1_,fconfig._32_6_)));
            if (fVar1 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                      ,0x5e5);
              e2e_multi_kvs_concurrent_wr::__test_pass = 0;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                              ,0x5e5,"void e2e_multi_kvs_concurrent_wr()");
              }
            }
            r = r + 1;
          } while( true );
        }
        for (r = 0; r < 8; r = r + 1) {
          sprintf(body + 0x38,"%dkey%d",(ulong)(uint)nf,(ulong)(uint)r);
          sprintf((char *)&tid_wr,"commit%d",(ulong)(uint)nf);
          strlen(body + 0x38);
          strlen((char *)&tid_wr);
          fVar1 = fdb_set_kv(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                             in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                             in_stack_fffffffffffffd08);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                    ,0x5d6);
            e2e_multi_kvs_concurrent_wr::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                            ,0x5d6,"void e2e_multi_kvs_concurrent_wr()");
            }
          }
        }
        fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffce8,'\0');
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                  ,0x5d9);
          e2e_multi_kvs_concurrent_wr::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                          ,0x5d9,"void e2e_multi_kvs_concurrent_wr()");
          }
        }
        nf = nf + 1;
      } while( true );
    }
    sprintf(body + 0x38,"e2edb_kv%d",(ulong)(uint)r);
    fVar1 = fdb_kvs_open((fdb_file_handle *)fconfig.block_reusing_threshold,
                         (fdb_kvs_handle **)fconfig._176_8_,
                         (char *)fconfig.encryption_key.bytes._20_8_,
                         (fdb_kvs_config *)fconfig.encryption_key.bytes._12_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,0x5cd);
      e2e_multi_kvs_concurrent_wr::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                      ,0x5cd,"void e2e_multi_kvs_concurrent_wr()");
      }
    }
    r = r + 1;
  } while( true );
}

Assistant:

void e2e_multi_kvs_concurrent_wr() {
    TEST_INIT();
    memleak_start();
    int i, j, r;
    int nf = 8;
    char buf[64];
    char body[64];

    thread_t *tid_wr = alca(thread_t, nf);
    void **thread_ret_wr = alca(void *, nf);
    fdb_file_handle *dbfile;
    fdb_kvs_handle **kvs = alca(fdb_kvs_handle*, nf);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    randomize();
    rm_storage_fs();
    r = system(SHELL_DEL" e2edb_main > errorlog.txt");
    fdb_iterator *it;
    (void)r;

    // create dbfile
    fdb_config fconfig = fdb_get_default_config();
    fconfig.num_keeping_headers = 10;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.compaction_mode  = FDB_COMPACTION_MANUAL;
    fdb_open(&dbfile, "e2edb_main", &fconfig);

    // open dbfiles
    for (i = 0; i < nf; i++) {
        sprintf(buf, "e2edb_kv%d", i);
        status = fdb_kvs_open(dbfile, &kvs[i], buf, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // initial commits
    for (j = 0; j < 10; j++) {
        for (i = 0; i < nf; i++) {
            sprintf(buf, "%dkey%d", j, i);
            sprintf(body, "commit%d", j);
            status = fdb_set_kv(kvs[i], buf, strlen(buf), body, strlen(body));
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // run update thread on each file to enter reuse
    for (i = 0; i < nf; i++) {
        thread_create(&tid_wr[i], update_thread, (void*)kvs[i]);
    }

    // join and rollback
    for (i = 0; i < nf; i++) {
        thread_join(tid_wr[i], &thread_ret_wr[i]);
        status = fdb_rollback(&kvs[i], 7);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    for (i = 0; i < nf; i++) {
        // verify rollback kvs
        status = fdb_iterator_init(kvs[i], &it, NULL, 0,
                                   NULL, 0, FDB_ITR_NONE);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        j = 0;
        do {
            status = fdb_iterator_get(it, &rdoc);
            TEST_CHK (status == FDB_RESULT_SUCCESS);
            fdb_doc_free(rdoc);
            rdoc=NULL;
            j++;
        } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
        TEST_CHK(j==7);
        fdb_iterator_close(it);
    }

    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();

    r = system(SHELL_DEL" e2edb_main > errorlog.txt");
    (void)r;

    TEST_RESULT("TEST: e2e multi kvs concurrent wr test");
}